

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

bool __thiscall
miniros::RPCManager::validateXmlrpcResponse
          (RPCManager *this,string *method,XmlRpcValue *response,XmlRpcValue *payload)

{
  int iVar1;
  Type *pTVar2;
  undefined8 uVar3;
  XmlRpcValue *pXVar4;
  int *piVar5;
  string *psVar6;
  undefined8 uVar7;
  XmlRpcValue *in_RDX;
  int offset;
  string empty_array;
  bool enabled_4;
  string status_string;
  bool enabled_3;
  int status_code;
  bool enabled_2;
  bool enabled_1;
  bool enabled;
  undefined8 in_stack_fffffffffffffde8;
  LogLocation *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  LogLocation *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe10;
  Level level;
  string *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  XmlRpcValue *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  void *pvVar8;
  undefined4 in_stack_fffffffffffffe38;
  Level LVar9;
  undefined4 in_stack_fffffffffffffe3c;
  allocator<char> local_141;
  string local_140 [32];
  undefined4 local_120;
  undefined1 local_11a;
  allocator<char> local_119;
  string local_118 [32];
  string local_f8 [38];
  undefined1 local_d2;
  allocator<char> local_d1;
  string local_d0 [32];
  int local_b0;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8 [38];
  undefined1 local_82;
  allocator<char> local_81;
  string local_80 [24];
  bool local_1;
  
  LVar9 = (Level)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  level = (Level)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  pTVar2 = XmlRpc::XmlRpcValue::getType(in_RDX);
  if (*pTVar2 == TypeArray) {
    iVar1 = XmlRpc::XmlRpcValue::size
                      ((XmlRpcValue *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38))
    ;
    if ((iVar1 == 2) ||
       (iVar1 = XmlRpc::XmlRpcValue::size
                          ((XmlRpcValue *)
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)),
       iVar1 == 3)) {
      pXVar4 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffdf0,LVar9);
      pTVar2 = XmlRpc::XmlRpcValue::getType(pXVar4);
      if (*pTVar2 == TypeInt) {
        XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffdf0,LVar9);
        piVar5 = XmlRpc::XmlRpcValue::operator_cast_to_int_
                           ((XmlRpcValue *)in_stack_fffffffffffffdf0);
        local_b0 = *piVar5;
        pXVar4 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffdf0,LVar9);
        pTVar2 = XmlRpc::XmlRpcValue::getType(pXVar4);
        if (*pTVar2 == TypeString) {
          XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffdf0,LVar9);
          psVar6 = XmlRpc::XmlRpcValue::operator_cast_to_string_
                             ((XmlRpcValue *)in_stack_fffffffffffffdf0);
          std::__cxx11::string::string(local_f8,(string *)psVar6);
          if (local_b0 == 1) {
            iVar1 = XmlRpc::XmlRpcValue::size
                              ((XmlRpcValue *)
                               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            if (iVar1 < 3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                         (allocator<char> *)CONCAT44(in_stack_fffffffffffffe24,iVar1));
              std::allocator<char>::~allocator(&local_141);
              XmlRpc::XmlRpcValue::XmlRpcValue
                        ((XmlRpcValue *)in_stack_fffffffffffffe00,
                         (string *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                         (int *)in_stack_fffffffffffffdf0);
              XmlRpc::XmlRpcValue::operator=
                        ((XmlRpcValue *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
              XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x497718);
              std::__cxx11::string::~string(local_140);
            }
            else {
              XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffdf0,LVar9);
              XmlRpc::XmlRpcValue::operator=
                        ((XmlRpcValue *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
            }
            local_1 = true;
          }
          else {
            if (((console::g_initialized ^ 0xff) & 1) != 0) {
              console::initialize();
            }
            if (((validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                  ::loc.initialized_ ^ 0xffU) & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
              console::initializeLogLocation
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         in_stack_fffffffffffffe18,level);
              std::__cxx11::string::~string(local_118);
              std::allocator<char>::~allocator(&local_119);
            }
            if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                ::loc.level_ != Debug) {
              console::setLogLocationLevel(in_stack_fffffffffffffdf0,LVar9);
              console::checkLogLocationEnabled(in_stack_fffffffffffffe00);
            }
            local_11a = (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                         ::loc.logger_enabled_ & 1U) != 0;
            if ((bool)local_11a) {
              pvVar8 = validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                       ::loc.logger_;
              LVar9 = validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                      ::loc.level_;
              uVar3 = std::__cxx11::string::c_str();
              iVar1 = local_b0;
              uVar7 = std::__cxx11::string::c_str();
              console::print((FilterBase *)0x0,pvVar8,(Level)(ulong)LVar9,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/rpc_manager.cpp"
                             ,0xf5,
                             "bool miniros::RPCManager::validateXmlrpcResponse(const std::string &, XmlRpcValue &, XmlRpcValue &)"
                             ,"XML-RPC call [%s] returned an error (%d): [%s]",uVar3,iVar1,uVar7);
            }
            local_1 = false;
          }
          local_120 = 1;
          std::__cxx11::string::~string(local_f8);
        }
        else {
          if (((console::g_initialized ^ 0xff) & 1) != 0) {
            console::initialize();
          }
          if (((validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                ::loc.initialized_ ^ 0xffU) & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
            console::initializeLogLocation
                      ((LogLocation *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       in_stack_fffffffffffffe18,level);
            std::__cxx11::string::~string(local_d0);
            std::allocator<char>::~allocator(&local_d1);
          }
          if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
              ::loc.level_ != Debug) {
            console::setLogLocationLevel(in_stack_fffffffffffffdf0,LVar9);
            console::checkLogLocationEnabled(in_stack_fffffffffffffe00);
          }
          pvVar8 = validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                   ::loc.logger_;
          LVar9 = validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                  ::loc.level_;
          local_d2 = (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                      ::loc.logger_enabled_ & 1U) != 0;
          if ((bool)local_d2) {
            uVar3 = std::__cxx11::string::c_str();
            console::print((FilterBase *)0x0,pvVar8,(Level)(ulong)LVar9,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/rpc_manager.cpp"
                           ,0xee,
                           "bool miniros::RPCManager::validateXmlrpcResponse(const std::string &, XmlRpcValue &, XmlRpcValue &)"
                           ,"XML-RPC call [%s] didn\'t return a string as the 2nd element",uVar3);
          }
          local_1 = false;
        }
      }
      else {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
              ::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          console::initializeLogLocation
                    ((LogLocation *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     in_stack_fffffffffffffe18,level);
          std::__cxx11::string::~string(local_a8);
          std::allocator<char>::~allocator(&local_a9);
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel(in_stack_fffffffffffffdf0,LVar9);
          console::checkLogLocationEnabled(in_stack_fffffffffffffe00);
        }
        pvVar8 = validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                 ::loc.logger_;
        LVar9 = validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                ::loc.level_;
        local_aa = (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                    ::loc.logger_enabled_ & 1U) != 0;
        if ((bool)local_aa) {
          uVar3 = std::__cxx11::string::c_str();
          console::print((FilterBase *)0x0,pvVar8,(Level)(ulong)LVar9,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/rpc_manager.cpp"
                         ,0xe7,
                         "bool miniros::RPCManager::validateXmlrpcResponse(const std::string &, XmlRpcValue &, XmlRpcValue &)"
                         ,"XML-RPC call [%s] didn\'t return a int as the 1st element",uVar3);
        }
        local_1 = false;
      }
    }
    else {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20))
        ;
        console::initializeLogLocation
                  ((LogLocation *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   in_stack_fffffffffffffe18,level);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator(&local_81);
      }
      if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
          ::loc.level_ != Debug) {
        console::setLogLocationLevel(in_stack_fffffffffffffdf0,LVar9);
        console::checkLogLocationEnabled(in_stack_fffffffffffffe00);
      }
      pvVar8 = validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
               ::loc.logger_;
      LVar9 = validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
              ::loc.level_;
      local_82 = (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                  ::loc.logger_enabled_ & 1U) != 0;
      if ((bool)local_82) {
        uVar3 = std::__cxx11::string::c_str();
        console::print((FilterBase *)0x0,pvVar8,(Level)(ulong)LVar9,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/rpc_manager.cpp"
                       ,0xe1,
                       "bool miniros::RPCManager::validateXmlrpcResponse(const std::string &, XmlRpcValue &, XmlRpcValue &)"
                       ,"XML-RPC call [%s] didn\'t return a 2 or 3-element array",uVar3);
      }
      local_1 = false;
    }
  }
  else {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((validateXmlrpcResponse::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      console::initializeLogLocation
                ((LogLocation *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe18,level);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    }
    if (validateXmlrpcResponse::loc.level_ != Debug) {
      console::setLogLocationLevel(in_stack_fffffffffffffdf0,LVar9);
      console::checkLogLocationEnabled(in_stack_fffffffffffffe00);
    }
    pvVar8 = validateXmlrpcResponse::loc.logger_;
    LVar9 = validateXmlrpcResponse::loc.level_;
    if ((validateXmlrpcResponse::loc.logger_enabled_ & 1U) != 0) {
      uVar3 = std::__cxx11::string::c_str();
      console::print((FilterBase *)0x0,pvVar8,(Level)(ulong)LVar9,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/rpc_manager.cpp"
                     ,0xdb,
                     "bool miniros::RPCManager::validateXmlrpcResponse(const std::string &, XmlRpcValue &, XmlRpcValue &)"
                     ,"XML-RPC call [%s] didn\'t return an array",uVar3);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RPCManager::validateXmlrpcResponse(const std::string& method, XmlRpcValue &response,
                                    XmlRpcValue &payload)
{
  if (response.getType() != XmlRpcValue::TypeArray)
  {
    MINIROS_DEBUG("XML-RPC call [%s] didn't return an array",
        method.c_str());
    return false;
  }
  if (response.size() != 2 && response.size() != 3)
  {
    MINIROS_DEBUG("XML-RPC call [%s] didn't return a 2 or 3-element array",
        method.c_str());
    return false;
  }
  if (response[0].getType() != XmlRpcValue::TypeInt)
  {
    MINIROS_DEBUG("XML-RPC call [%s] didn't return a int as the 1st element",
        method.c_str());
    return false;
  }
  int status_code = response[0];
  if (response[1].getType() != XmlRpcValue::TypeString)
  {
    MINIROS_DEBUG("XML-RPC call [%s] didn't return a string as the 2nd element",
        method.c_str());
    return false;
  }
  std::string status_string = response[1];
  if (status_code != 1)
  {
    MINIROS_DEBUG("XML-RPC call [%s] returned an error (%d): [%s]",
        method.c_str(), status_code, status_string.c_str());
    return false;
  }
  if (response.size() > 2)
  {
    payload = response[2];
  }
  else
  {
    std::string empty_array = "<value><array><data></data></array></value>";
    int offset = 0;
    payload = XmlRpcValue(empty_array, &offset);
  }
  return true;
}